

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steed.c
# Opt level: O2

int doride(void)

{
  char cVar1;
  boolean bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  obj *poVar6;
  trap *ptVar7;
  char *pcVar8;
  permonst *ppVar9;
  monst *mon;
  char *pcVar10;
  monst *pmVar11;
  int iVar12;
  bool bVar13;
  schar dy;
  schar dx;
  permonst *local_148;
  schar dz;
  char buf [256];
  
  if (u.usteed != (monst *)0x0) {
    dismount_steed(6);
    return 1;
  }
  iVar3 = getdir((char *)0x0,&dx,&dy,&dz);
  if (iVar3 == 0) {
    return 0;
  }
  if (0x4e < ((int)u.ux + (int)dx) - 1U) {
    return 0;
  }
  if (0x14 < (uint)((int)dy + (int)u.uy)) {
    return 0;
  }
  if (flags.debug == '\0') {
    bVar13 = false;
  }
  else {
    cVar1 = yn_function("Force the mount to succeed?","yn",'n');
    bVar13 = cVar1 == 'y';
  }
  pmVar11 = level->monsters[(long)dx + (long)u.ux][(long)dy + (long)u.uy];
  mon = (monst *)0x0;
  if ((pmVar11 != (monst *)0x0) && ((pmVar11->field_0x61 & 2) == 0)) {
    mon = pmVar11;
  }
  if (u.usteed != (monst *)0x0) {
    pcVar5 = mon_nam(u.usteed);
    pcVar10 = "You are already riding %s.";
    goto LAB_00245e14;
  }
  if ((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) {
LAB_00245e57:
    if (u.uprops[0x20].extrinsic != 0 || u.uprops[0x20].intrinsic != 0) {
      pcVar5 = body_part(9);
      pcVar5 = makeplural(pcVar5);
      pline("Your %s are in no shape for riding.",pcVar5);
      if (!bVar13) {
        return 0;
      }
      if (flags.debug == '\0') {
        return 0;
      }
      cVar1 = yn_function("Heal your legs?","yn",'n');
      if (cVar1 != 'y') {
        return 0;
      }
      u.uprops[0x20].extrinsic = 0;
      u.uprops[0x20].intrinsic = 0;
    }
    if ((u.umonnum == u.umonster) ||
       (((((youmonst.data)->mflags1 >> 0x11 & 1) != 0 &&
         (((youmonst.data)->mflags1 >> 0x13 & 1) == 0)) && ((byte)((youmonst.data)->msize - 1) < 2))
       )) {
      if (bVar13) {
        if (mon == (monst *)0x0) {
LAB_002461be:
          pcVar5 = "I see nobody there.";
        }
        else {
LAB_00245ef3:
          if ((uball == (obj *)0x0 && u.utrap == 0) &&
              (u.ustuck == (monst *)0x0 && (u._1052_1_ & 1) == 0)) {
            iVar3 = 1;
            bVar2 = test_move((int)u.ux,(int)u.uy,(int)mon->mx - (int)u.ux,(int)mon->my - (int)u.uy,
                              0,1);
            if (bVar2 != '\0') {
              poVar6 = which_armor(mon,0x100000);
              if (poVar6 == (obj *)0x0) {
                pcVar5 = Monnam(mon);
                pcVar10 = "%s is not saddled.";
                goto LAB_00245e14;
              }
              ppVar9 = mon->data;
              if (((ppVar9 == mons + 0xc || ppVar9 == mons + 0xb) && (u.uprops[8].extrinsic == 0))
                 && (((byte)youmonst.mintrinsics & 0x80) == 0)) {
                local_148 = ppVar9;
                pcVar5 = mon_nam(mon);
                pline("You touch %s.",pcVar5);
                pcVar5 = mons_mname(mon->data);
                pcVar5 = an(pcVar5);
                sprintf(buf,"attempting to ride %s",pcVar5);
                bVar2 = delayed_petrify((char *)0x0,buf);
                ppVar9 = local_148;
                if (bVar2 != '\0') {
                  pcVar5 = "You stop your mounting attempt.";
                  goto LAB_002461c8;
                }
              }
              cVar1 = mon->mtame;
              if ((cVar1 == '\0') || ((*(uint *)&mon->field_0x60 >> 0x1a & 1) != 0)) {
                pcVar5 = mon_nam(mon);
                pcVar10 = "I think %s would mind.";
                goto LAB_00245e14;
              }
              if ((*(uint *)&mon->field_0x60 >> 0x17 & 1) != 0) {
                ptVar7 = t_at(level,(int)mon->mx,(int)mon->my);
                pcVar10 = mon_nam(mon);
                iVar3 = pronoun_gender(level,mon);
                pcVar5 = genders[iVar3].he;
                pcVar8 = an(defexplain[(ulong)((byte)ptVar7->field_0x8 & 0x1f) + 0x2f]);
                pline("You can\'t mount %s while %s\'s trapped in %s.",pcVar10,pcVar5,pcVar8);
                return 0;
              }
              local_148 = ppVar9;
              if ((bVar13) || (urole.malenum == 0x15f)) {
                if (!bVar13) goto LAB_00246318;
              }
              else {
                cVar1 = cVar1 + -1;
                mon->mtame = cVar1;
                if (cVar1 == '\0') {
                  newsym((int)mon->mx,(int)mon->my);
                  pcVar5 = Monnam(mon);
                  pcVar10 = " and its leash comes off";
                  if ((*(uint *)&mon->field_0x60 >> 0x18 & 1) == 0) {
                    pcVar10 = "";
                  }
                  pline("%s resists%s!",pcVar5,pcVar10);
                  if ((mon->field_0x63 & 1) == 0) {
                    return 0;
                  }
                  m_unleash(mon,'\0');
                  return 0;
                }
LAB_00246318:
                if (((u._1052_1_ & 2) != 0) && ((ppVar9->mflags1 & 2) == 0)) {
                  pcVar5 = "You can\'t ride that creature while under water.";
                  goto LAB_002461c5;
                }
              }
              bVar2 = can_saddle(mon);
              if ((bVar2 != '\0') && (pmVar11 = mon, bVar2 = can_ride(mon), bVar2 != '\0')) {
                if ((((bVar13) || (local_148->mlet == '\x05')) || ((local_148->mflags1 & 1) != 0))
                   || (((u.uprops[0x12].intrinsic == 0 && u.uprops[0x12].extrinsic == 0 ||
                        (((u.uprops[0x12].extrinsic & 0xffffdfff) == 0 &&
                         (u.uprops[0x12].intrinsic & 0xef000000) == 0) &&
                         ((u.uprops[0x12].extrinsic & 0x2000) != 0 ||
                         (u.uprops[0x12].intrinsic & 0x10000000) != 0))) &&
                       ((youmonst.data)->mlet != '\x05')))) {
                  if (uarm == (obj *)0x0 || bVar13) {
                    if (bVar13) goto LAB_00246481;
                  }
                  else if (((ushort)((*(ushort *)&objects[uarm->otyp].field_0x11 >> 4 & 0x1f) - 0xb)
                            < 7) && (uVar4 = *(uint *)&uarm->field_0x4a & 0x300,
                                    (*(uint *)&uarm->field_0x4a >> 10 & 3) != 0 || uVar4 != 0)) {
                    pcVar5 = "rusty";
                    if (uVar4 == 0) {
                      pcVar5 = "corroded";
                    }
                    pcVar10 = mon_nam(mon);
                    pline("Your %s armor is too stiff to be able to mount %s.",pcVar5,pcVar10);
                    return 0;
                  }
                  if (((((u.uprops[0x1c].intrinsic == 0) && (u.uprops[0x25].intrinsic == 0)) &&
                       (u.uprops[0x25].extrinsic == 0)) &&
                      ((u.uprops[0x29].intrinsic == 0 && (u.uprops[0x20].intrinsic == 0)))) &&
                     ((u.uprops[0x20].extrinsic == 0 &&
                      (((poVar6->field_0x4a & 1) == 0 &&
                       (iVar12 = cVar1 + u.ulevel, iVar3 = rnd((int)pmVar11), iVar3 <= iVar12))))))
                  {
                    if ((((u.uprops[0x12].extrinsic != 0 || u.uprops[0x12].intrinsic != 0) ||
                         ((youmonst.data)->mlet == '\x05')) && (local_148->mlet != '\x05')) &&
                       ((local_148->mflags1 & 1) == 0)) {
                      pcVar5 = Monnam(mon);
                      pline("%s magically floats up!",pcVar5);
                    }
                    pcVar5 = mon_nam(mon);
                    pline("You mount %s.",pcVar5);
LAB_00246481:
                    u.usteed = mon;
                    remove_monster(level,(int)mon->mx,(int)mon->my);
                    teleds((int)mon->mx,(int)mon->my,'\x01');
                    return 1;
                  }
                  if ((u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) &&
                     ((youmonst.data)->mlet != '\x05')) {
                    pcVar5 = mon_nam(mon);
                    pline("You slip while trying to get on %s.",pcVar5);
                    pcVar5 = x_monnam(mon,2,(char *)0x0,7,'\x01');
                    sprintf(buf,"slipped while mounting %s",pcVar5);
                    uVar4 = mt_random();
                    losehp(uVar4 % 5 + 10,buf,2);
                    return 0;
                  }
                  pcVar5 = Monnam(mon);
                  pcVar10 = "%s slips away from you.";
                }
                else {
                  pcVar5 = mon_nam(mon);
                  pcVar10 = "You cannot reach %s.";
                }
                goto LAB_00245e14;
              }
              pcVar5 = "You can\'t ride such a creature.";
              goto LAB_002461c5;
            }
          }
          if ((uball != (obj *)0x0) ||
             ((((u._1052_1_ & 1) == 0 && (u.ustuck == (monst *)0x0)) && (u.utrap == 0)))) {
            pcVar5 = body_part(9);
            pcVar10 = "You are unable to swing your %s over.";
LAB_00245e14:
            pline(pcVar10,pcVar5);
            return 0;
          }
          pcVar5 = "You are stuck here for now.";
        }
      }
      else {
        iVar3 = near_capacity();
        if (iVar3 < 2) {
          if (mon == (monst *)0x0) goto LAB_002461be;
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002460bd;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002460b8;
          }
          else {
LAB_002460b8:
            if (ublindf != (obj *)0x0) {
LAB_002460bd:
              if (ublindf->oartifact == '\x1d') goto LAB_002461ab;
            }
            if ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
                 (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
                 youmonst.data != mons + 0x32) || (u.uprops[0x19].blocked != 0)) goto LAB_002461be;
          }
LAB_002461ab:
          if (((mon->field_0x60 & 0x80) != 0) || ((byte)(mon->m_ap_type - 1) < 2))
          goto LAB_002461be;
          goto LAB_00245ef3;
        }
        pcVar5 = "You can\'t do that while carrying so much stuff.";
      }
    }
    else {
      pcVar5 = "You won\'t fit on a saddle.";
    }
  }
  else {
    if (u.umonnum == u.umonster) {
      if (bVar13) goto LAB_00245e57;
    }
    else {
      bVar2 = dmgtype(youmonst.data,0x24);
      if (bVar2 != '\0' || bVar13) goto LAB_00245e57;
    }
    pcVar5 = "Maybe you should find a designated driver.";
  }
LAB_002461c5:
  iVar3 = 0;
LAB_002461c8:
  pline(pcVar5);
  return iVar3;
}

Assistant:

int doride(void)
{
	boolean forcemount = FALSE;
	schar dx, dy, dz;

	if (u.usteed)
	    dismount_steed(DISMOUNT_BYCHOICE);
	else if (getdir(NULL, &dx, &dy, &dz) &&
	         isok(u.ux+dx, u.uy+dy)) {
	    if (wizard && yn("Force the mount to succeed?") == 'y')
		forcemount = TRUE;
	    return mount_steed(m_at(level, u.ux+dx, u.uy+dy), forcemount);
	} else
	    return 0;
	return 1;
}